

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_compress_usingCTable_generic
                 (void *dst,size_t dstSize,void *src,size_t srcSize,FSE_CTable *ct,uint fast)

{
  uint uVar1;
  BIT_CStream_t *bitC_00;
  ulong in_RCX;
  ulong in_RDX;
  size_t in_RSI;
  void *in_RDI;
  int in_R9D;
  size_t initError;
  FSE_CState_t CState2;
  FSE_CState_t CState1;
  BIT_CStream_t bitC;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  BIT_CStream_t *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff54;
  FSE_CState_t *in_stack_ffffffffffffff58;
  BIT_CStream_t *in_stack_ffffffffffffff60;
  BIT_CStream_t local_78;
  ulong local_50;
  long local_48;
  ulong local_40;
  int local_34;
  ulong local_28;
  size_t local_8;
  
  local_50 = in_RDX + in_RCX;
  if (in_RCX < 3) {
    local_8 = 0;
  }
  else {
    local_48 = local_50;
    local_40 = in_RDX;
    local_34 = in_R9D;
    local_28 = in_RCX;
    bitC_00 = (BIT_CStream_t *)BIT_initCStream(&local_78,in_RDI,in_RSI);
    uVar1 = ERR_isError((size_t)bitC_00);
    if (uVar1 == 0) {
      if ((local_28 & 1) == 0) {
        local_50 = local_50 + -1;
        FSE_initCState2((FSE_CState_t *)in_stack_ffffffffffffff60,
                        (FSE_CTable *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        local_50 = local_50 - 1;
        FSE_initCState2((FSE_CState_t *)in_stack_ffffffffffffff60,
                        (FSE_CTable *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      }
      else {
        local_50 = local_50 + -1;
        FSE_initCState2((FSE_CState_t *)in_stack_ffffffffffffff60,
                        (FSE_CTable *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        local_50 = local_50 + -1;
        FSE_initCState2((FSE_CState_t *)in_stack_ffffffffffffff60,
                        (FSE_CTable *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        local_50 = local_50 - 1;
        FSE_encodeSymbol(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
        if (local_34 == 0) {
          BIT_flushBits(bitC_00);
        }
        else {
          BIT_flushBitsFast(bitC_00);
        }
      }
      local_28 = local_28 - 2;
      if ((local_28 & 2) != 0) {
        local_50 = local_50 - 1;
        FSE_encodeSymbol(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
        local_50 = local_50 - 1;
        FSE_encodeSymbol(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
        if (local_34 == 0) {
          BIT_flushBits(bitC_00);
        }
        else {
          BIT_flushBitsFast(bitC_00);
        }
      }
      while (local_40 < local_50) {
        local_50 = local_50 - 1;
        FSE_encodeSymbol(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
        local_50 = local_50 + -1;
        FSE_encodeSymbol(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
        local_50 = local_50 + -1;
        FSE_encodeSymbol(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
        local_50 = local_50 - 1;
        FSE_encodeSymbol(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
        if (local_34 == 0) {
          BIT_flushBits(bitC_00);
        }
        else {
          BIT_flushBitsFast(bitC_00);
        }
      }
      FSE_flushCState(bitC_00,(FSE_CState_t *)in_stack_ffffffffffffff38);
      FSE_flushCState(bitC_00,(FSE_CState_t *)in_stack_ffffffffffffff38);
      local_8 = BIT_closeCStream(in_stack_ffffffffffffff38);
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

static size_t FSE_compress_usingCTable_generic (void* dst, size_t dstSize,
                           const void* src, size_t srcSize,
                           const FSE_CTable* ct, const unsigned fast)
{
    const BYTE* const istart = (const BYTE*) src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip=iend;

    BIT_CStream_t bitC;
    FSE_CState_t CState1, CState2;

    /* init */
    if (srcSize <= 2) return 0;
    { size_t const initError = BIT_initCStream(&bitC, dst, dstSize);
      if (FSE_isError(initError)) return 0; /* not enough space available to write a bitstream */ }

#define FSE_FLUSHBITS(s)  (fast ? BIT_flushBitsFast(s) : BIT_flushBits(s))

    if (srcSize & 1) {
        FSE_initCState2(&CState1, ct, *--ip);
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    } else {
        FSE_initCState2(&CState2, ct, *--ip);
        FSE_initCState2(&CState1, ct, *--ip);
    }

    /* join to mod 4 */
    srcSize -= 2;
    if ((sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) && (srcSize & 2)) {  /* test bit 2 */
        FSE_encodeSymbol(&bitC, &CState2, *--ip);
        FSE_encodeSymbol(&bitC, &CState1, *--ip);
        FSE_FLUSHBITS(&bitC);
    }

    /* 2 or 4 encoding per loop */
    while ( ip>istart ) {

        FSE_encodeSymbol(&bitC, &CState2, *--ip);

        if (sizeof(bitC.bitContainer)*8 < FSE_MAX_TABLELOG*2+7 )   /* this test must be static */
            FSE_FLUSHBITS(&bitC);

        FSE_encodeSymbol(&bitC, &CState1, *--ip);

        if (sizeof(bitC.bitContainer)*8 > FSE_MAX_TABLELOG*4+7 ) {  /* this test must be static */
            FSE_encodeSymbol(&bitC, &CState2, *--ip);
            FSE_encodeSymbol(&bitC, &CState1, *--ip);
        }

        FSE_FLUSHBITS(&bitC);
    }

    FSE_flushCState(&bitC, &CState2);
    FSE_flushCState(&bitC, &CState1);
    return BIT_closeCStream(&bitC);
}